

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O0

int lws_ssl_capable_read_no_ssl(lws *wsi,uchar *buf,int len)

{
  lws_context_per_thread *pt_00;
  int *piVar1;
  ssize_t sVar2;
  uint *puVar3;
  int local_3c;
  int n;
  lws_context_per_thread *pt;
  lws_context *context;
  int len_local;
  uchar *buf_local;
  lws *wsi_local;
  
  pt_00 = wsi->context->pt + (int)wsi->tsi;
  lws_stats_bump(pt_00,2,1);
  piVar1 = __errno_location();
  *piVar1 = 0;
  if (wsi->udp == (lws_udp *)0x0) {
    sVar2 = recv((wsi->desc).sockfd,buf,(long)len,0);
    local_3c = (int)sVar2;
  }
  else {
    wsi->udp->salen = 0x10;
    sVar2 = recvfrom((wsi->desc).sockfd,buf,(long)len,0,(sockaddr *)wsi->udp,&wsi->udp->salen);
    local_3c = (int)sVar2;
  }
  if (local_3c < 0) {
    piVar1 = __errno_location();
    if (((*piVar1 != 0xb) && (piVar1 = __errno_location(), *piVar1 != 0xb)) &&
       (piVar1 = __errno_location(), *piVar1 != 4)) {
      puVar3 = (uint *)__errno_location();
      _lws_log(8,"error on reading from skt : %d\n",(ulong)*puVar3);
      return -1;
    }
    wsi_local._4_4_ = -4;
  }
  else if ((local_3c == 0) && ((*(ulong *)&wsi->field_0x2dc >> 0x23 & 1) != 0)) {
    wsi_local._4_4_ = -1;
  }
  else if (local_3c == 0) {
    wsi_local._4_4_ = -1;
  }
  else {
    lws_stats_bump(pt_00,0xf,(long)local_3c);
    wsi_local._4_4_ = local_3c;
  }
  return wsi_local._4_4_;
}

Assistant:

int
lws_ssl_capable_read_no_ssl(struct lws *wsi, unsigned char *buf, int len)
{
	struct lws_context *context = wsi->context;
	struct lws_context_per_thread *pt = &context->pt[(int)wsi->tsi];
	int n = 0;

	lws_stats_bump(pt, LWSSTATS_C_API_READ, 1);

	errno = 0;
#if defined(LWS_WITH_UDP)
	if (lws_wsi_is_udp(wsi)) {
		wsi->udp->salen = sizeof(wsi->udp->sa);
		n = recvfrom(wsi->desc.sockfd, (char *)buf, len, 0,
			     &wsi->udp->sa, &wsi->udp->salen);
	} else
#endif
		n = recv(wsi->desc.sockfd, (char *)buf, len, 0);

	if (n >= 0) {

		if (!n && wsi->unix_skt)
			return LWS_SSL_CAPABLE_ERROR;

		/*
		 * See https://libwebsockets.org/
		 * pipermail/libwebsockets/2019-March/007857.html
		 */
		if (!n)
			return LWS_SSL_CAPABLE_ERROR;

#if defined(LWS_WITH_SERVER_STATUS)
		if (wsi->vhost)
			wsi->vhost->conn_stats.rx += n;
#endif
		lws_stats_bump(pt, LWSSTATS_B_READ, n);

		return n;
	}

	if (LWS_ERRNO == LWS_EAGAIN ||
	    LWS_ERRNO == LWS_EWOULDBLOCK ||
	    LWS_ERRNO == LWS_EINTR)
		return LWS_SSL_CAPABLE_MORE_SERVICE;

	lwsl_info("error on reading from skt : %d\n", LWS_ERRNO);
	return LWS_SSL_CAPABLE_ERROR;
}